

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderAtomicCountersTests.cpp
# Opt level: O0

long __thiscall glcts::AdvancedUsageSwitchPrograms::Setup(AdvancedUsageSwitchPrograms *this)

{
  AdvancedUsageSwitchPrograms *this_local;
  
  memset(this->counter_buffer_,0,0x20);
  this->xfb_buffer_ = 0;
  this->vbo_ = 0;
  this->vao_ = 0;
  memset(this->prog_,0,0x20);
  this->rt_ = 0;
  this->fbo_ = 0;
  return 0;
}

Assistant:

virtual long Setup()
	{
		memset(counter_buffer_, 0, sizeof(counter_buffer_));
		xfb_buffer_ = 0;
		vao_ = vbo_ = 0;
		memset(prog_, 0, sizeof(prog_));
		fbo_ = rt_ = 0;
		return NO_ERROR;
	}